

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

PackageSymbol * __thiscall slang::ast::WildcardImportSymbol::getPackage(WildcardImportSymbol *this)

{
  bool bVar1;
  PackageImportItemSyntax *pPVar2;
  PackageSymbol **ppPVar3;
  SourceLocation in_R8;
  string_view packageName;
  PackageSymbol *local_48;
  _Storage<const_slang::ast::PackageSymbol_*,_true> local_40;
  undefined8 local_38;
  SourceLocation local_30;
  SyntaxNode *local_28;
  SyntaxNode *syntax;
  SourceLocation loc;
  Scope *scope;
  WildcardImportSymbol *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->package);
  if (!bVar1) {
    loc = (SourceLocation)Symbol::getParentScope(&this->super_Symbol);
    if (loc == (SourceLocation)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x86,"const PackageSymbol *slang::ast::WildcardImportSymbol::getPackage() const");
    }
    syntax = *(SyntaxNode **)&(this->super_Symbol).location;
    local_28 = Symbol::getSyntax(&this->super_Symbol);
    if (local_28 != (SyntaxNode *)0x0) {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(local_28);
      local_30 = parsing::Token::location(&pPVar2->package);
      syntax = (SyntaxNode *)local_30;
    }
    packageName._M_str = (char *)loc;
    packageName._M_len = (size_t)(this->packageName)._M_str;
    local_48 = findPackage((ast *)(this->packageName)._M_len,packageName,(Scope *)syntax,in_R8);
    std::optional<const_slang::ast::PackageSymbol_*>::
    optional<const_slang::ast::PackageSymbol_*,_true>
              ((optional<const_slang::ast::PackageSymbol_*> *)&local_40,&local_48);
    (this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_payload = local_40;
    *(undefined8 *)
     &(this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload
      .super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_engaged = local_38;
  }
  ppPVar3 = std::optional<const_slang::ast::PackageSymbol_*>::operator*(&this->package);
  return *ppPVar3;
}

Assistant:

const PackageSymbol* WildcardImportSymbol::getPackage() const {
    if (!package) {
        const Scope* scope = getParentScope();
        ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax(); syntax)
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package = findPackage(packageName, *scope, loc);
    }
    return *package;
}